

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncTask.cpp
# Opt level: O1

int nite::AsyncTask::init(EVP_PKEY_CTX *ctx)

{
  element_type *peVar1;
  int iVar2;
  long lVar3;
  pointer psVar4;
  
  iVar2 = pthread_mutex_init((pthread_mutex_t *)&asyncTaskMutex,(pthread_mutexattr_t *)0x0);
  if (iVar2 != 0) {
    iVar2 = 0x247ab4;
    print("failed to start mutex");
    exit(iVar2);
  }
  iVar2 = pthread_mutex_init((pthread_mutex_t *)&uniqueIdMutex,(pthread_mutexattr_t *)0x0);
  if (iVar2 != 0) {
    iVar2 = 0x247ab4;
    print("failed to start mutex");
    exit(iVar2);
  }
  pthread_mutex_lock((pthread_mutex_t *)&asyncTaskMutex);
  if ((long)pool.
            super__Vector_base<std::shared_ptr<nite::AsyncTask::Context>,_std::allocator<std::shared_ptr<nite::AsyncTask::Context>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)pool.
            super__Vector_base<std::shared_ptr<nite::AsyncTask::Context>,_std::allocator<std::shared_ptr<nite::AsyncTask::Context>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar3 = (long)pool.
                  super__Vector_base<std::shared_ptr<nite::AsyncTask::Context>,_std::allocator<std::shared_ptr<nite::AsyncTask::Context>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)pool.
                  super__Vector_base<std::shared_ptr<nite::AsyncTask::Context>,_std::allocator<std::shared_ptr<nite::AsyncTask::Context>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    psVar4 = pool.
             super__Vector_base<std::shared_ptr<nite::AsyncTask::Context>,_std::allocator<std::shared_ptr<nite::AsyncTask::Context>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar1 = (psVar4->super___shared_ptr<nite::AsyncTask::Context,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar1->state != '\x03') {
        peVar1->state = '\x03';
      }
      psVar4 = psVar4 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&asyncTaskMutex);
  return iVar2;
}

Assistant:

void  nite::AsyncTask::init(){
    if(pthread_mutex_init(&asyncTaskMutex, NULL) != 0){ 
        nite::print("failed to start mutex");
        nite::exit();
    }  
    if(pthread_mutex_init(&uniqueIdMutex, NULL) != 0){ 
        nite::print("failed to start mutex");
        nite::exit();
    } 		
	pthread_mutex_lock(&asyncTaskMutex);
	for(int i = 0; i < pool.size(); ++i){
		auto task = pool[i].get();
		task->stop();
	}	
	pthread_mutex_unlock(&asyncTaskMutex);
}